

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

SharedPluralRules *
icu_63::PluralRules::createSharedInstance(Locale *locale,UPluralType type,UErrorCode *status)

{
  SharedPluralRules *result;
  SharedPluralRules *local_10;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == UPLURAL_TYPE_CARDINAL) {
      local_10 = (SharedPluralRules *)0x0;
      UnifiedCache::getByLocale<icu_63::SharedPluralRules>(locale,&local_10,status);
      return local_10;
    }
    *status = U_UNSUPPORTED_ERROR;
  }
  return (SharedPluralRules *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }